

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_1_6_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  float *pfVar27;
  int iVar28;
  float *data;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  float *pfVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  float *pfVar47;
  int k_count;
  byte bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar81 [12];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  int l_count0_1;
  int l0_1;
  int data_width;
  int l0;
  int l_count0;
  float local_b8;
  
  auVar56._8_4_ = 0x80000000;
  auVar56._0_8_ = 0x8000000080000000;
  auVar56._12_4_ = 0x80000000;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  fVar64 = ipoint->scale;
  auVar84 = ZEXT464((uint)fVar64);
  auVar49 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)fVar64),auVar56,0xf8);
  auVar49 = ZEXT416((uint)(fVar64 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  iVar45 = (int)auVar49._0_4_;
  fVar62 = -0.08 / (fVar64 * fVar64);
  auVar50 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)ipoint->x),auVar56,0xf8);
  auVar50 = ZEXT416((uint)(ipoint->x + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51._0_8_ = (double)auVar50._0_4_;
  auVar51._8_8_ = auVar50._8_8_;
  auVar55._0_8_ = (double)fVar64;
  auVar55._8_8_ = 0;
  auVar50 = vfmadd231sd_fma(auVar51,auVar55,ZEXT816(0x3fe0000000000000));
  auVar54._0_4_ = (float)auVar50._0_8_;
  auVar54._4_12_ = auVar50._4_12_;
  auVar50 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)ipoint->y),auVar56,0xf8);
  auVar50 = ZEXT416((uint)(ipoint->y + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar52._0_8_ = (double)auVar50._0_4_;
  auVar52._8_8_ = auVar50._8_8_;
  auVar50 = vfmadd231sd_fma(auVar52,auVar55,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar50._0_8_;
  auVar53._4_12_ = auVar50._4_12_;
  auVar50._0_4_ = (int)auVar49._0_4_;
  auVar50._4_4_ = (int)auVar49._4_4_;
  auVar50._8_4_ = (int)auVar49._8_4_;
  auVar50._12_4_ = (int)auVar49._12_4_;
  auVar49 = vcvtdq2ps_avx(auVar50);
  fVar3 = auVar54._0_4_ - auVar49._0_4_;
  fVar4 = auVar53._0_4_ - auVar49._0_4_;
  auVar49 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar64),auVar54);
  auVar50 = vpternlogd_avx512vl(auVar57,auVar49,auVar56,0xf8);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar50._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = ZEXT416((uint)fVar64);
  if (iVar45 < (int)auVar49._0_4_) {
    auVar49 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar50,auVar53);
    auVar58._8_4_ = 0x3effffff;
    auVar58._0_8_ = 0x3effffff3effffff;
    auVar58._12_4_ = 0x3effffff;
    auVar59._8_4_ = 0x80000000;
    auVar59._0_8_ = 0x8000000080000000;
    auVar59._12_4_ = 0x80000000;
    auVar51 = vpternlogd_avx512vl(auVar59,auVar49,auVar58,0xea);
    auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
    auVar49 = vroundss_avx(auVar49,auVar49,0xb);
    if (iVar45 < (int)auVar49._0_4_) {
      auVar49 = vfmadd231ss_fma(auVar54,auVar50,ZEXT416(0x41300000));
      auVar60._8_4_ = 0x80000000;
      auVar60._0_8_ = 0x8000000080000000;
      auVar60._12_4_ = 0x80000000;
      auVar51 = vpternlogd_avx512vl(auVar60,auVar49,auVar58,0xea);
      auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
      auVar49 = vroundss_avx(auVar49,auVar49,0xb);
      if ((int)auVar49._0_4_ + iVar45 <= iimage->width) {
        auVar49 = vfmadd231ss_fma(auVar53,auVar50,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar51 = vpternlogd_avx512vl(auVar58,auVar49,auVar14,0xf8);
        auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
        auVar49 = vroundss_avx(auVar49,auVar49,0xb);
        if ((int)auVar49._0_4_ + iVar45 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar38 = iimage->data;
          iVar1 = iimage->data_width;
          iVar18 = iVar45 * 2;
          pfVar27 = haarResponseY + 5;
          pfVar47 = haarResponseX + 5;
          iVar34 = -0xc;
          lVar24 = 0;
          do {
            auVar49._0_4_ = (float)iVar34;
            auVar49._4_12_ = in_ZMM9._4_12_;
            auVar49 = vfmadd213ss_fma(auVar49,auVar50,ZEXT416((uint)(fVar4 + 0.5)));
            iVar19 = (int)auVar49._0_4_;
            iVar20 = (iVar19 + -1) * iVar1;
            iVar21 = (iVar19 + -1 + iVar45) * iVar1;
            iVar19 = (iVar19 + -1 + iVar18) * iVar1;
            lVar32 = 0;
            do {
              iVar22 = (int)lVar32;
              auVar71._0_4_ = (float)(iVar22 + -0xc);
              auVar71._4_12_ = in_ZMM10._4_12_;
              auVar49 = vfmadd213ss_fma(auVar71,auVar50,ZEXT416((uint)fVar3));
              iVar46 = (int)auVar49._0_4_;
              auVar80._0_4_ = (float)(iVar22 + -0xb);
              auVar80._4_12_ = in_ZMM10._4_12_;
              auVar49 = vfmadd213ss_fma(auVar80,auVar50,ZEXT416((uint)fVar3));
              auVar78._0_4_ = (float)(iVar22 + -10);
              auVar81 = in_ZMM9._4_12_;
              auVar78._4_12_ = auVar81;
              auVar77._0_4_ = (float)(iVar22 + -9);
              auVar77._4_12_ = auVar81;
              auVar74._0_4_ = (float)(iVar22 + -8);
              auVar74._4_12_ = auVar81;
              auVar72._0_4_ = (float)(iVar22 + -7);
              auVar72._4_12_ = auVar81;
              iVar41 = iVar46 + -1 + iVar45;
              iVar28 = iVar46 + -1 + iVar18;
              fVar64 = pfVar38[iVar21 + -1 + iVar46];
              fVar63 = pfVar38[iVar19 + -1 + iVar46];
              fVar75 = pfVar38[iVar28 + iVar19];
              iVar42 = (int)auVar49._0_4_;
              auVar52 = ZEXT416((uint)fVar3);
              auVar49 = vfmadd213ss_fma(auVar78,auVar50,auVar52);
              fVar5 = pfVar38[iVar20 + -1 + iVar46];
              fVar6 = pfVar38[iVar20 + iVar28];
              auVar53 = SUB6416(ZEXT464(0x40000000),0);
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar41] -
                                                      pfVar38[iVar41 + iVar19])),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              fVar68 = pfVar38[iVar21 + iVar28];
              pfVar47[lVar32 + -5] = (fVar63 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar68)),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              pfVar27[lVar32 + -5] = auVar51._0_4_ - (fVar63 - fVar6);
              iVar41 = iVar42 + -1 + iVar45;
              iVar28 = iVar42 + -1 + iVar18;
              fVar64 = pfVar38[iVar21 + -1 + iVar42];
              fVar63 = pfVar38[iVar19 + -1 + iVar42];
              in_ZMM10 = ZEXT464((uint)pfVar38[iVar28 + iVar19]);
              iVar46 = (int)auVar49._0_4_;
              auVar49 = vfmadd213ss_fma(auVar77,auVar50,auVar52);
              fVar75 = pfVar38[iVar20 + iVar28];
              auVar54 = ZEXT416((uint)(pfVar38[iVar28 + iVar19] - pfVar38[iVar20 + -1 + iVar42]));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar41] -
                                                      pfVar38[iVar41 + iVar19])),auVar53,auVar54);
              fVar5 = pfVar38[iVar21 + iVar28];
              pfVar47[lVar32 + -4] = (fVar63 - fVar75) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar5)),auVar53,auVar54);
              pfVar27[lVar32 + -4] = auVar51._0_4_ - (fVar63 - fVar75);
              iVar41 = iVar46 + -1 + iVar45;
              iVar28 = iVar46 + -1 + iVar18;
              fVar64 = pfVar38[iVar21 + -1 + iVar46];
              fVar63 = pfVar38[iVar19 + -1 + iVar46];
              in_ZMM9 = ZEXT464((uint)pfVar38[iVar28 + iVar19]);
              iVar42 = (int)auVar49._0_4_;
              auVar49 = vfmadd213ss_fma(auVar74,auVar50,auVar52);
              fVar75 = pfVar38[iVar20 + iVar28];
              auVar54 = ZEXT416((uint)(pfVar38[iVar28 + iVar19] - pfVar38[iVar20 + -1 + iVar46]));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar41] -
                                                      pfVar38[iVar41 + iVar19])),auVar53,auVar54);
              fVar5 = pfVar38[iVar21 + iVar28];
              pfVar47[lVar32 + -3] = (fVar63 - fVar75) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar5)),auVar53,auVar54);
              pfVar27[lVar32 + -3] = auVar51._0_4_ - (fVar63 - fVar75);
              iVar41 = iVar42 + -1 + iVar45;
              iVar28 = iVar42 + -1 + iVar18;
              fVar64 = pfVar38[iVar21 + -1 + iVar42];
              fVar63 = pfVar38[iVar19 + -1 + iVar42];
              fVar75 = pfVar38[iVar28 + iVar19];
              iVar46 = (int)auVar49._0_4_;
              auVar49 = vfmadd213ss_fma(auVar72,auVar50,auVar52);
              fVar5 = pfVar38[iVar20 + -1 + iVar42];
              fVar6 = pfVar38[iVar20 + iVar28];
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar41] -
                                                      pfVar38[iVar41 + iVar19])),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              fVar68 = pfVar38[iVar21 + iVar28];
              pfVar47[lVar32 + -2] = (fVar63 - fVar6) + auVar51._0_4_;
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar68)),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              pfVar27[lVar32 + -2] = auVar51._0_4_ - (fVar63 - fVar6);
              iVar41 = iVar46 + -1 + iVar45;
              iVar28 = iVar46 + -1 + iVar18;
              fVar64 = pfVar38[iVar21 + -1 + iVar46];
              fVar63 = pfVar38[iVar19 + -1 + iVar46];
              fVar75 = pfVar38[iVar28 + iVar19];
              iVar42 = (int)auVar49._0_4_;
              fVar5 = pfVar38[iVar20 + -1 + iVar46];
              fVar6 = pfVar38[iVar20 + iVar28];
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar41] -
                                                      pfVar38[iVar41 + iVar19])),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              fVar68 = pfVar38[iVar21 + iVar28];
              pfVar47[lVar32 + -1] = (fVar63 - fVar6) + auVar49._0_4_;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar68)),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              iVar41 = iVar42 + -1 + iVar45;
              iVar28 = iVar42 + -1 + iVar18;
              pfVar27[lVar32 + -1] = auVar49._0_4_ - (fVar63 - fVar6);
              fVar64 = pfVar38[iVar21 + -1 + iVar42];
              fVar63 = pfVar38[iVar19 + -1 + iVar42];
              fVar75 = pfVar38[iVar28 + iVar19];
              fVar5 = pfVar38[iVar20 + -1 + iVar42];
              fVar6 = pfVar38[iVar20 + iVar28];
              fVar68 = pfVar38[iVar21 + iVar28];
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar20 + iVar41] -
                                                      pfVar38[iVar41 + iVar19])),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              pfVar47[lVar32] = (fVar63 - fVar6) + auVar49._0_4_;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar64 - fVar68)),auVar53,
                                        ZEXT416((uint)(fVar75 - fVar5)));
              pfVar27[lVar32] = auVar49._0_4_ - (fVar63 - fVar6);
              lVar32 = lVar32 + 6;
            } while (iVar22 + -0xc < 6);
            iVar34 = iVar34 + 1;
            lVar24 = lVar24 + 1;
            pfVar27 = pfVar27 + 0x18;
            pfVar47 = pfVar47 + 0x18;
          } while (lVar24 != 0x18);
          goto LAB_001a5e44;
        }
      }
    }
  }
  iVar1 = iVar45 * 2;
  iVar18 = -0xc;
  lVar32 = 0;
  lVar24 = 0;
  do {
    auVar65._0_4_ = (float)iVar18;
    auVar65._4_12_ = in_ZMM8._4_12_;
    auVar49 = vfmadd213ss_fma(auVar65,auVar84._0_16_,ZEXT416((uint)fVar4));
    fVar63 = auVar49._0_4_;
    iVar41 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    iVar19 = iVar1 + iVar41;
    iVar20 = iVar41 + -1;
    iVar21 = iVar41 + -1 + iVar45;
    lVar31 = lVar32;
    iVar34 = -0xc;
    do {
      auVar66._0_4_ = (float)iVar34;
      auVar66._4_12_ = in_ZMM8._4_12_;
      auVar49 = vfmadd213ss_fma(auVar66,auVar84._0_16_,ZEXT416((uint)fVar3));
      auVar76._0_4_ = (float)(iVar34 + 1);
      auVar76._4_12_ = in_ZMM8._4_12_;
      auVar51 = vfmadd213ss_fma(auVar76,auVar84._0_16_,ZEXT416((uint)fVar3));
      fVar75 = auVar51._0_4_;
      fVar63 = auVar49._0_4_;
      pfVar38 = (float *)((long)haarResponseY + lVar31);
      iVar28 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      if ((((iVar41 < 1) || (iVar28 < 1)) || (iimage->height < iVar19)) ||
         (iVar22 = iVar1 + iVar28, iimage->width < iVar22)) {
        haarXY(iimage,iVar41,iVar28,iVar45,(float *)((long)haarResponseX + lVar31),pfVar38);
      }
      else {
        iVar42 = iVar28 + -1 + iVar45;
        pfVar47 = iimage->data;
        iVar46 = iimage->data_width;
        iVar40 = iVar46 * iVar20;
        fVar63 = pfVar47[iVar46 * iVar21 + -1 + iVar28];
        iVar35 = iVar46 * (iVar1 + -1 + iVar41);
        fVar5 = pfVar47[iVar35 + -1 + iVar28];
        fVar6 = pfVar47[iVar35 + -1 + iVar22];
        fVar68 = pfVar47[iVar40 + -1 + iVar28];
        fVar7 = pfVar47[iVar40 + -1 + iVar22];
        fVar8 = pfVar47[iVar46 * iVar21 + -1 + iVar22];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar40 + iVar42] - pfVar47[iVar35 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar68)));
        *(float *)((long)haarResponseX + lVar31) = (fVar5 - fVar7) + auVar49._0_4_;
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar68)));
        *pfVar38 = auVar49._0_4_ - (fVar5 - fVar7);
      }
      iVar28 = (int)((double)((ulong)(0.0 <= fVar75) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar75) * -0x4020000000000000) + (double)fVar75);
      pfVar38 = (float *)((long)haarResponseX + lVar31 + 4);
      pfVar47 = (float *)((long)haarResponseY + lVar31 + 4);
      if (((iVar41 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar28, iimage->width < iVar22)))) {
        haarXY(iimage,iVar41,iVar28,iVar45,pfVar38,pfVar47);
      }
      else {
        iVar42 = iVar28 + -1 + iVar45;
        pfVar27 = iimage->data;
        iVar46 = iimage->data_width;
        iVar40 = iVar46 * iVar20;
        fVar63 = pfVar27[iVar46 * iVar21 + -1 + iVar28];
        iVar35 = iVar46 * (iVar1 + -1 + iVar41);
        fVar75 = pfVar27[iVar35 + -1 + iVar28];
        fVar5 = pfVar27[iVar35 + -1 + iVar22];
        fVar6 = pfVar27[iVar40 + -1 + iVar28];
        fVar68 = pfVar27[iVar40 + -1 + iVar22];
        fVar7 = pfVar27[iVar46 * iVar21 + -1 + iVar22];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar40 + iVar42] - pfVar27[iVar35 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar75 - fVar68) + auVar49._0_4_;
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = auVar49._0_4_ - (fVar75 - fVar68);
      }
      auVar49 = vpbroadcastd_avx512vl();
      auVar49 = vpaddd_avx(auVar49,_DAT_005766e0);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar16._4_4_ = fVar3;
      auVar16._0_4_ = fVar3;
      auVar16._8_4_ = fVar3;
      auVar16._12_4_ = fVar3;
      auVar17._4_4_ = fVar64;
      auVar17._0_4_ = fVar64;
      auVar17._8_4_ = fVar64;
      auVar17._12_4_ = fVar64;
      auVar51 = vfmadd132ps_fma(auVar49,auVar16,auVar17);
      auVar49 = vshufps_avx(auVar51,auVar51,0xff);
      uVar25 = vcmpps_avx512vl(auVar51,_DAT_00576190,0xd);
      bVar48 = (byte)(uVar25 >> 3);
      iVar28 = (int)((double)((ulong)(bVar48 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 & 1) * -0x4020000000000000) +
                    (double)auVar49._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar31 + 8);
      pfVar47 = (float *)((long)haarResponseY + lVar31 + 8);
      if (((iVar41 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar28, iimage->width < iVar22)))) {
        haarXY(iimage,iVar41,iVar28,iVar45,pfVar38,pfVar47);
      }
      else {
        iVar42 = iVar28 + -1 + iVar45;
        pfVar27 = iimage->data;
        iVar46 = iimage->data_width;
        iVar40 = iVar46 * iVar20;
        fVar63 = pfVar27[iVar46 * iVar21 + -1 + iVar28];
        iVar35 = iVar46 * (iVar1 + -1 + iVar41);
        fVar75 = pfVar27[iVar35 + -1 + iVar28];
        fVar5 = pfVar27[iVar35 + -1 + iVar22];
        fVar6 = pfVar27[iVar40 + -1 + iVar28];
        fVar68 = pfVar27[iVar40 + -1 + iVar22];
        fVar7 = pfVar27[iVar46 * iVar21 + -1 + iVar22];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar40 + iVar42] - pfVar27[iVar35 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar75 - fVar68) + auVar49._0_4_;
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = auVar49._0_4_ - (fVar75 - fVar68);
      }
      bVar48 = (byte)uVar25;
      auVar49 = vpermilpd_avx(auVar51,1);
      iVar28 = (int)((double)((ulong)(bVar48 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar49._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar31 + 0xc);
      pfVar47 = (float *)((long)haarResponseY + lVar31 + 0xc);
      if ((((iVar41 < 1) || (iVar28 < 1)) || (iimage->height < iVar19)) ||
         (iVar22 = iVar1 + iVar28, iimage->width < iVar22)) {
        haarXY(iimage,iVar41,iVar28,iVar45,pfVar38,pfVar47);
      }
      else {
        iVar42 = iVar28 + -1 + iVar45;
        pfVar27 = iimage->data;
        iVar46 = iimage->data_width;
        iVar40 = iVar46 * iVar20;
        fVar63 = pfVar27[iVar46 * iVar21 + -1 + iVar28];
        iVar35 = iVar46 * (iVar1 + -1 + iVar41);
        fVar75 = pfVar27[iVar35 + -1 + iVar28];
        fVar5 = pfVar27[iVar35 + -1 + iVar22];
        fVar6 = pfVar27[iVar40 + -1 + iVar28];
        fVar68 = pfVar27[iVar40 + -1 + iVar22];
        fVar7 = pfVar27[iVar46 * iVar21 + -1 + iVar22];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar40 + iVar42] - pfVar27[iVar35 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar75 - fVar68) + auVar49._0_4_;
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = auVar49._0_4_ - (fVar75 - fVar68);
      }
      auVar49 = vmovshdup_avx(auVar51);
      iVar28 = (int)((double)((ulong)(bVar48 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar49._0_4_);
      pfVar38 = (float *)((long)haarResponseX + lVar31 + 0x10);
      pfVar47 = (float *)((long)haarResponseY + lVar31 + 0x10);
      if (((iVar41 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar28, iimage->width < iVar22)))) {
        haarXY(iimage,iVar41,iVar28,iVar45,pfVar38,pfVar47);
      }
      else {
        iVar42 = iVar28 + -1 + iVar45;
        pfVar27 = iimage->data;
        iVar46 = iimage->data_width;
        iVar40 = iVar46 * iVar20;
        fVar63 = pfVar27[iVar46 * iVar21 + -1 + iVar28];
        iVar35 = iVar46 * (iVar1 + -1 + iVar41);
        fVar75 = pfVar27[iVar35 + -1 + iVar28];
        fVar5 = pfVar27[iVar35 + -1 + iVar22];
        fVar6 = pfVar27[iVar40 + -1 + iVar28];
        fVar68 = pfVar27[iVar40 + -1 + iVar22];
        fVar7 = pfVar27[iVar46 * iVar21 + -1 + iVar22];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar40 + iVar42] - pfVar27[iVar35 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar75 - fVar68) + auVar49._0_4_;
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = auVar49._0_4_ - (fVar75 - fVar68);
      }
      local_b8 = auVar51._0_4_;
      iVar28 = (int)((double)((ulong)(bVar48 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 & 1) * -0x4020000000000000) + (double)local_b8);
      pfVar38 = (float *)((long)haarResponseX + lVar31 + 0x14);
      pfVar47 = (float *)((long)haarResponseY + lVar31 + 0x14);
      if (((iVar41 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar19 || (iVar22 = iVar1 + iVar28, iimage->width < iVar22)))) {
        haarXY(iimage,iVar41,iVar28,iVar45,pfVar38,pfVar47);
      }
      else {
        iVar42 = iVar28 + -1 + iVar45;
        pfVar27 = iimage->data;
        iVar46 = iimage->data_width;
        iVar40 = iVar46 * iVar20;
        fVar63 = pfVar27[iVar46 * iVar21 + -1 + iVar28];
        iVar35 = iVar46 * (iVar1 + -1 + iVar41);
        fVar75 = pfVar27[iVar35 + -1 + iVar28];
        fVar5 = pfVar27[iVar35 + -1 + iVar22];
        fVar6 = pfVar27[iVar40 + -1 + iVar28];
        fVar68 = pfVar27[iVar40 + -1 + iVar22];
        fVar7 = pfVar27[iVar46 * iVar21 + -1 + iVar22];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar27[iVar40 + iVar42] - pfVar27[iVar35 + iVar42]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar75 - fVar68) + auVar49._0_4_;
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(fVar63 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar47 = auVar49._0_4_ - (fVar75 - fVar68);
      }
      auVar84 = ZEXT1664(auVar50);
      lVar31 = lVar31 + 0x18;
      bVar2 = iVar34 < 6;
      iVar34 = iVar34 + 6;
    } while (bVar2);
    iVar18 = iVar18 + 1;
    lVar24 = lVar24 + 1;
    lVar32 = lVar32 + 0x60;
  } while (lVar24 != 0x18);
LAB_001a5e44:
  fVar64 = auVar84._0_4_;
  auVar83._8_4_ = 0x3effffff;
  auVar83._0_8_ = 0x3effffff3effffff;
  auVar83._12_4_ = 0x3effffff;
  auVar82._8_4_ = 0x80000000;
  auVar82._0_8_ = 0x8000000080000000;
  auVar82._12_4_ = 0x80000000;
  auVar49 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 0.5)),auVar82,0xf8);
  auVar49 = ZEXT416((uint)(fVar64 * 0.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 1.5)),auVar82,0xf8);
  auVar50 = ZEXT416((uint)(fVar64 * 1.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 2.5)),auVar82,0xf8);
  auVar51 = ZEXT416((uint)(fVar64 * 2.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 3.5)),auVar82,0xf8);
  auVar52 = ZEXT416((uint)(fVar64 * 3.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 4.5)),auVar82,0xf8);
  auVar53 = ZEXT416((uint)(fVar64 * 4.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 5.5)),auVar82,0xf8);
  auVar54 = ZEXT416((uint)(fVar64 * 5.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 6.5)),auVar82,0xf8);
  auVar55 = ZEXT416((uint)(fVar64 * 6.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 7.5)),auVar82,0xf8);
  auVar56 = ZEXT416((uint)(auVar56._0_4_ + fVar64 * 7.5));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 8.5)),auVar82,0xf8);
  auVar57 = ZEXT416((uint)(fVar64 * 8.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 9.5)),auVar82,0xf8);
  auVar58 = ZEXT416((uint)(fVar64 * 9.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 10.5)),auVar82,0xf8);
  auVar59 = ZEXT416((uint)(fVar64 * 10.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar83,ZEXT416((uint)(fVar64 * 11.5)),auVar82,0xf8);
  auVar60 = ZEXT416((uint)(fVar64 * 11.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  fVar68 = auVar51._0_4_;
  fVar64 = fVar68 + auVar50._0_4_;
  fVar3 = fVar68 + auVar49._0_4_;
  fVar4 = fVar68 - auVar49._0_4_;
  fVar63 = fVar68 - auVar50._0_4_;
  fVar75 = fVar68 - auVar52._0_4_;
  fVar5 = fVar68 - auVar53._0_4_;
  fVar6 = fVar68 - auVar54._0_4_;
  fVar68 = fVar68 - auVar55._0_4_;
  fVar79 = auVar56._0_4_;
  fVar7 = fVar79 - auVar52._0_4_;
  fVar8 = fVar79 - auVar53._0_4_;
  fVar9 = fVar79 - auVar54._0_4_;
  fVar10 = fVar79 - auVar55._0_4_;
  fVar11 = fVar79 - auVar57._0_4_;
  fVar12 = fVar79 - auVar58._0_4_;
  fVar13 = fVar79 - auVar59._0_4_;
  fVar79 = fVar79 - auVar60._0_4_;
  gauss_s1_c0[0] = expf(fVar64 * fVar64 * fVar62);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar62);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar62);
  gauss_s1_c0[3] = expf(fVar63 * fVar63 * fVar62);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar75 * fVar75 * fVar62);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar62);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar62);
  gauss_s1_c0[8] = expf(fVar68 * fVar68 * fVar62);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar62);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar62);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar62);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar62);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar62);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar62);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar62);
  gauss_s1_c1[8] = expf(fVar79 * fVar79 * fVar62);
  uVar25 = 0xfffffff8;
  lVar24 = 0;
  fVar64 = 0.0;
  auVar67._8_4_ = 0x7fffffff;
  auVar67._0_8_ = 0x7fffffff7fffffff;
  auVar67._12_4_ = 0x7fffffff;
  lVar32 = 0;
  lVar31 = 0;
  do {
    pfVar38 = gauss_s1_c1;
    uVar23 = (uint)uVar25;
    if (uVar23 != 7) {
      pfVar38 = gauss_s1_c0;
    }
    if (uVar23 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    lVar32 = (long)(int)lVar32;
    iVar45 = (int)lVar31;
    lVar31 = (long)iVar45;
    lVar37 = (long)haarResponseX + lVar24;
    lVar30 = (long)haarResponseY + lVar24;
    uVar36 = 0xfffffff8;
    uVar33 = 0;
    do {
      pfVar47 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar47 = gauss_s1_c0;
      }
      if (uVar36 == 0xfffffff8) {
        pfVar47 = gauss_s1_c1;
      }
      uVar26 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      auVar84 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar29 = uVar33;
      lVar43 = lVar37;
      lVar44 = lVar30;
      do {
        lVar39 = 0;
        pfVar27 = (float *)((long)pfVar38 + (ulong)(uint)((int)(uVar25 >> 0x1f) << 5));
        do {
          fVar3 = pfVar47[uVar26] * *pfVar27;
          auVar49 = vinsertps_avx(ZEXT416(*(uint *)(lVar44 + lVar39 * 4)),
                                  ZEXT416(*(uint *)(lVar43 + lVar39 * 4)),0x10);
          auVar73._0_4_ = fVar3 * auVar49._0_4_;
          auVar73._4_4_ = fVar3 * auVar49._4_4_;
          auVar73._8_4_ = fVar3 * auVar49._8_4_;
          auVar73._12_4_ = fVar3 * auVar49._12_4_;
          auVar49 = vandps_avx(auVar73,auVar67);
          auVar49 = vmovlhps_avx(auVar73,auVar49);
          auVar69._0_4_ = auVar84._0_4_ + auVar49._0_4_;
          auVar69._4_4_ = auVar84._4_4_ + auVar49._4_4_;
          auVar69._8_4_ = auVar84._8_4_ + auVar49._8_4_;
          auVar69._12_4_ = auVar84._12_4_ + auVar49._12_4_;
          auVar84 = ZEXT1664(auVar69);
          pfVar27 = pfVar27 + (ulong)(~uVar23 >> 0x1f) * 2 + -1;
          lVar39 = lVar39 + 1;
        } while (lVar39 != 9);
        uVar29 = uVar29 + 0x18;
        uVar26 = uVar26 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar43 = lVar43 + 0x60;
        lVar44 = lVar44 + 0x60;
      } while (uVar29 < uVar36 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar31];
      auVar15._4_4_ = fVar3;
      auVar15._0_4_ = fVar3;
      auVar15._8_4_ = fVar3;
      auVar15._12_4_ = fVar3;
      auVar51 = vmulps_avx512vl(auVar69,auVar15);
      lVar31 = lVar31 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar32) = auVar51;
      auVar70._0_4_ = auVar51._0_4_ * auVar51._0_4_;
      auVar70._4_4_ = auVar51._4_4_ * auVar51._4_4_;
      auVar70._8_4_ = auVar51._8_4_ * auVar51._8_4_;
      auVar70._12_4_ = auVar51._12_4_ * auVar51._12_4_;
      auVar49 = vmovshdup_avx(auVar70);
      auVar50 = vfmadd231ss_fma(auVar49,auVar51,auVar51);
      auVar49 = vshufpd_avx(auVar51,auVar51,1);
      auVar50 = vfmadd213ss_fma(auVar49,auVar49,auVar50);
      auVar49 = vshufps_avx(auVar51,auVar51,0xff);
      auVar49 = vfmadd213ss_fma(auVar49,auVar49,auVar50);
      fVar64 = fVar64 + auVar49._0_4_;
      lVar32 = lVar32 + 4;
      uVar36 = uVar36 + 5;
      uVar33 = uVar33 + 0x78;
      lVar37 = lVar37 + 0x1e0;
      lVar30 = lVar30 + 0x1e0;
    } while (iVar45 + 4 != (int)lVar31);
    lVar24 = lVar24 + 0x14;
    uVar25 = (ulong)(uVar23 + 5);
  } while ((int)uVar23 < 3);
  if (fVar64 < 0.0) {
    fVar64 = sqrtf(fVar64);
  }
  else {
    auVar49 = vsqrtss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
    fVar64 = auVar49._0_4_;
  }
  auVar84 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar64)));
  lVar24 = 0;
  do {
    auVar61 = vmulps_avx512f(auVar84,*(undefined1 (*) [64])(ipoint->descriptor + lVar24));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar24) = auVar61;
    lVar24 = lVar24 + 0x10;
  } while (lVar24 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}